

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# high_primitives.c
# Opt level: O2

void al_draw_filled_rounded_rectangle
               (float x1,float y1,float x2,float y2,float rx,float ry,ALLEGRO_COLOR color)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  ALLEGRO_VERTEX *pAVar6;
  long lVar7;
  ALLEGRO_VERTEX *dest;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float local_2428;
  float fStack_2424;
  ALLEGRO_VERTEX vertex_cache [256];
  
  fVar11 = get_scale();
  fVar12 = (rx + ry) * 0.5;
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
  }
  else {
    fVar12 = SQRT(fVar12);
  }
  uVar5 = (uint)(fVar11 * 10.0 * fVar12 * 0.25);
  if ((int)uVar5 < 2) {
    al_draw_filled_rectangle(x1,y1,x2,y2,color);
    return;
  }
  uVar9 = 0x3f;
  if (uVar5 < 0x3f) {
    uVar9 = (ulong)uVar5;
  }
  dest = vertex_cache;
  al_calculate_arc(&dest->x,0x24,0.0,0.0,rx,ry,0.0,1.5707964,0.0,(int)uVar9 + 1);
  pAVar6 = dest + uVar9;
  uVar8 = uVar9;
  while( true ) {
    pAVar6 = pAVar6 + -1;
    bVar10 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar10) break;
    uVar1 = pAVar6->x;
    uVar3 = pAVar6->y;
    dest[uVar9].x = (x1 + rx) - (float)uVar1;
    dest[uVar9].y = (y1 + ry) - (float)uVar3;
    dest[uVar9 * 2].x = (x1 + rx) - dest->x;
    dest[uVar9 * 2].y = dest->y + (y2 - ry);
    uVar2 = pAVar6->x;
    uVar4 = pAVar6->y;
    dest[uVar9 * 3].x = (float)uVar2 + (x2 - rx);
    dest[uVar9 * 3].y = (float)uVar4 + (y2 - ry);
    dest = dest + 1;
  }
  local_2428 = color.r;
  fStack_2424 = color.g;
  for (lVar7 = 0; uVar9 * 0x24 - lVar7 != 0; lVar7 = lVar7 + 0x24) {
    *(float *)((long)&vertex_cache[0].x + lVar7) =
         *(float *)((long)&vertex_cache[0].x + lVar7) + (x2 - rx);
    *(float *)((long)&vertex_cache[0].y + lVar7) =
         (y1 + ry) - *(float *)((long)&vertex_cache[0].y + lVar7);
  }
  for (lVar7 = 0; uVar9 * 0x90 - lVar7 != 0; lVar7 = lVar7 + 0x24) {
    *(float *)((long)&vertex_cache[0].color.r + lVar7) = local_2428;
    *(float *)((long)&vertex_cache[0].color.g + lVar7) = fStack_2424;
    *(float *)((long)&vertex_cache[0].color.b + lVar7) = color.b;
    *(float *)((long)&vertex_cache[0].color.a + lVar7) = color.a;
    *(undefined4 *)((long)&vertex_cache[0].z + lVar7) = 0;
  }
  al_draw_prim(vertex_cache,(ALLEGRO_VERTEX_DECL *)0x0,(ALLEGRO_BITMAP *)0x0,0,(int)uVar9 * 4,5);
  return;
}

Assistant:

void al_draw_filled_rounded_rectangle(float x1, float y1, float x2, float y2,
   float rx, float ry, ALLEGRO_COLOR color)
{
   LOCAL_VERTEX_CACHE;
   int ii;
   float scale = get_scale();
   int num_segments = ALLEGRO_PRIM_QUALITY * scale * sqrtf((rx + ry) / 2.0f) / 4;

   ASSERT(rx >= 0);
   ASSERT(ry >= 0);
   
   /* In case rx and ry are both 0. */
   if (num_segments < 2) {
      al_draw_filled_rectangle(x1, y1, x2, y2, color);
      return;
   }

   if (num_segments * 4 >= ALLEGRO_VERTEX_CACHE_SIZE) {
      num_segments = (ALLEGRO_VERTEX_CACHE_SIZE - 1) / 4;
   }
   
   al_calculate_arc(&(vertex_cache[0].x), sizeof(ALLEGRO_VERTEX), 0, 0, rx, ry, 0, ALLEGRO_PI / 2, 0, num_segments + 1);

   for (ii = 0; ii < num_segments; ii++) {
      vertex_cache[ii + 1 * num_segments].x = x1 + rx - vertex_cache[num_segments - 1 - ii].x;
      vertex_cache[ii + 1 * num_segments].y = y1 + ry - vertex_cache[num_segments - 1 - ii].y;

      vertex_cache[ii + 2 * num_segments].x = x1 + rx - vertex_cache[ii].x;
      vertex_cache[ii + 2 * num_segments].y = y2 - ry + vertex_cache[ii].y;

      vertex_cache[ii + 3 * num_segments].x = x2 - rx + vertex_cache[num_segments - 1 - ii].x;
      vertex_cache[ii + 3 * num_segments].y = y2 - ry + vertex_cache[num_segments - 1 - ii].y;
   }
   for (ii = 0; ii < num_segments; ii++) {
      vertex_cache[ii].x = x2 - rx + vertex_cache[ii].x;
      vertex_cache[ii].y = y1 + ry - vertex_cache[ii].y;
   }

   for (ii = 0; ii < 4 * num_segments; ii++) {
      vertex_cache[ii].color = color;
      vertex_cache[ii].z = 0;
   }

   /*
   TODO: Doing this as a triangle fan just doesn't sound all that great, perhaps shuffle the vertices somehow to at least make it a strip
   */
   al_draw_prim(vertex_cache, 0, 0, 0, 4 * num_segments, ALLEGRO_PRIM_TRIANGLE_FAN);
}